

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

Expression * __thiscall
wasm::OptimizeInstructions::optimizeMemoryCopy(OptimizeInstructions *this,MemoryCopy *memCopy)

{
  PassRunner *pPVar1;
  Expression *pEVar2;
  Name memory;
  bool bVar3;
  Block *pBVar4;
  int64_t iVar5;
  Load *value;
  Store *pSVar6;
  uint bytes;
  initializer_list<wasm::Expression_*> *items;
  Expression *ptr;
  Type type;
  size_t sVar7;
  char *pcVar8;
  undefined1 local_58 [16];
  Drop local_48;
  Builder local_30;
  Builder builder;
  
  pPVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).super_Pass.runner;
  if ((((pPVar1->options).ignoreImplicitTraps != false) ||
      ((pPVar1->options).trapsNeverHappen == true)) &&
     (bVar3 = areConsecutiveInputsEqualAndFoldable(this,memCopy->dest,memCopy->source), bVar3)) {
    local_30.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
         ).
         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .currModule;
    local_48.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ =
         Builder::makeDrop(&local_30,memCopy->dest);
    local_48.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
         (uintptr_t)Builder::makeDrop(&local_30,memCopy->source);
    local_48.value = (Expression *)Builder::makeDrop(&local_30,memCopy->size);
    items = (initializer_list<wasm::Expression_*> *)local_58;
    local_58._8_8_ = (Drop *)0x3;
    local_58._0_8_ = &local_48;
LAB_008ee371:
    pBVar4 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>(&local_30,items);
    return (Expression *)pBVar4;
  }
  if (memCopy->size->_id != ConstId) {
    return (Expression *)0x0;
  }
  iVar5 = Literal::getInteger((Literal *)(memCopy->size + 1));
  local_30.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
       ).
       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
       .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>.
       currModule;
  switch(iVar5) {
  case 0:
    if (((pPVar1->options).ignoreImplicitTraps != false) ||
       ((pPVar1->options).trapsNeverHappen == true)) {
      local_58._0_8_ = Builder::makeDrop(&local_30,memCopy->dest);
      local_58._8_8_ = Builder::makeDrop(&local_30,memCopy->source);
      items = (initializer_list<wasm::Expression_*> *)&local_48;
      local_48.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id = 2;
      local_48.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ =
           (Drop *)local_58;
      goto LAB_008ee371;
    }
    break;
  case 1:
  case 2:
  case 4:
    ptr = memCopy->dest;
    pEVar2 = memCopy->source;
    local_48.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ =
         (memCopy->sourceMemory).super_IString.str._M_len;
    local_48.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
         (uintptr_t)(memCopy->sourceMemory).super_IString.str._M_str;
    value = MixedArena::alloc<wasm::Load>(&(local_30.wasm)->allocator);
    value->isAtomic = false;
    value->bytes = (uint8_t)iVar5;
    value->signed_ = false;
    (value->offset).addr = 0;
    (value->align).addr = 1;
    value->ptr = pEVar2;
    (value->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 2;
    (value->memory).super_IString.str._M_len =
         local_48.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_;
    (value->memory).super_IString.str._M_str =
         (char *)local_48.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.
                 id;
    sVar7 = (memCopy->destMemory).super_IString.str._M_len;
    pcVar8 = (memCopy->destMemory).super_IString.str._M_str;
    type.id = 2;
    bytes = (uint)iVar5;
    goto LAB_008ee501;
  case 3:
  case 5:
  case 6:
  case 7:
    break;
  case 8:
    ptr = memCopy->dest;
    pEVar2 = memCopy->source;
    local_48.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ =
         (memCopy->sourceMemory).super_IString.str._M_len;
    local_48.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
         (uintptr_t)(memCopy->sourceMemory).super_IString.str._M_str;
    value = MixedArena::alloc<wasm::Load>(&(local_30.wasm)->allocator);
    value->isAtomic = false;
    value->bytes = '\b';
    value->signed_ = false;
    (value->offset).addr = 0;
    (value->align).addr = 1;
    value->ptr = pEVar2;
    (value->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 3;
    (value->memory).super_IString.str._M_len =
         local_48.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_;
    (value->memory).super_IString.str._M_str =
         (char *)local_48.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.
                 id;
    sVar7 = (memCopy->destMemory).super_IString.str._M_len;
    pcVar8 = (memCopy->destMemory).super_IString.str._M_str;
    type.id = 3;
    bytes = 8;
LAB_008ee501:
    memory.super_IString.str._M_str = pcVar8;
    memory.super_IString.str._M_len = sVar7;
    pSVar6 = Builder::makeStore(&local_30,bytes,(Address)0x0,1,ptr,(Expression *)value,type,memory);
    return (Expression *)pSVar6;
  default:
    if (((iVar5 == 0x10) && ((pPVar1->options).shrinkLevel == 0)) &&
       ((((local_30.wasm)->features).features & 8) != 0)) {
      ptr = memCopy->dest;
      pEVar2 = memCopy->source;
      local_48.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ =
           (memCopy->sourceMemory).super_IString.str._M_len;
      local_48.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
           (uintptr_t)(memCopy->sourceMemory).super_IString.str._M_str;
      value = MixedArena::alloc<wasm::Load>(&(local_30.wasm)->allocator);
      value->isAtomic = false;
      value->bytes = '\x10';
      value->signed_ = false;
      (value->offset).addr = 0;
      (value->align).addr = 1;
      value->ptr = pEVar2;
      (value->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 6;
      (value->memory).super_IString.str._M_len =
           local_48.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_;
      (value->memory).super_IString.str._M_str =
           (char *)local_48.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type
                   .id;
      sVar7 = (memCopy->destMemory).super_IString.str._M_len;
      pcVar8 = (memCopy->destMemory).super_IString.str._M_str;
      type.id = 6;
      bytes = 0x10;
      goto LAB_008ee501;
    }
  }
  return (Expression *)0x0;
}

Assistant:

Expression* optimizeMemoryCopy(MemoryCopy* memCopy) {
    auto& options = getPassOptions();

    if (options.ignoreImplicitTraps || options.trapsNeverHappen) {
      if (areConsecutiveInputsEqual(memCopy->dest, memCopy->source)) {
        // memory.copy(x, x, sz)  ==>  {drop(x), drop(x), drop(sz)}
        Builder builder(*getModule());
        return builder.makeBlock({builder.makeDrop(memCopy->dest),
                                  builder.makeDrop(memCopy->source),
                                  builder.makeDrop(memCopy->size)});
      }
    }

    // memory.copy(dst, src, C)  ==>  store(dst, load(src))
    if (auto* csize = memCopy->size->dynCast<Const>()) {
      auto bytes = csize->value.getInteger();
      Builder builder(*getModule());

      switch (bytes) {
        case 0: {
          if (options.ignoreImplicitTraps || options.trapsNeverHappen) {
            // memory.copy(dst, src, 0)  ==>  {drop(dst), drop(src)}
            return builder.makeBlock({builder.makeDrop(memCopy->dest),
                                      builder.makeDrop(memCopy->source)});
          }
          break;
        }
        case 1:
        case 2:
        case 4: {
          return builder.makeStore(bytes, // bytes
                                   0,     // offset
                                   1,     // align
                                   memCopy->dest,
                                   builder.makeLoad(bytes,
                                                    false,
                                                    0,
                                                    1,
                                                    memCopy->source,
                                                    Type::i32,
                                                    memCopy->sourceMemory),
                                   Type::i32,
                                   memCopy->destMemory);
        }
        case 8: {
          return builder.makeStore(bytes, // bytes
                                   0,     // offset
                                   1,     // align
                                   memCopy->dest,
                                   builder.makeLoad(bytes,
                                                    false,
                                                    0,
                                                    1,
                                                    memCopy->source,
                                                    Type::i64,
                                                    memCopy->sourceMemory),
                                   Type::i64,
                                   memCopy->destMemory);
        }
        case 16: {
          if (options.shrinkLevel == 0) {
            // This adds an extra 2 bytes so apply it only for
            // minimal shrink level
            if (getModule()->features.hasSIMD()) {
              return builder.makeStore(bytes, // bytes
                                       0,     // offset
                                       1,     // align
                                       memCopy->dest,
                                       builder.makeLoad(bytes,
                                                        false,
                                                        0,
                                                        1,
                                                        memCopy->source,
                                                        Type::v128,
                                                        memCopy->sourceMemory),
                                       Type::v128,
                                       memCopy->destMemory);
            }
          }
          break;
        }
        default: {
        }
      }
    }
    return nullptr;
  }